

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nonrd_pickmode.c
# Opt level: O0

void setup_compound_prediction
               (AV1_COMMON *cm,MACROBLOCK *x,buf_2d (*yv12_mb) [3],int *use_ref_frame_mask,
               MV_REFERENCE_FRAME *rf,int *ref_mv_idx)

{
  long lVar1;
  int8_t ref_frame;
  YV12_BUFFER_CONFIG *pYVar2;
  scale_factors *in_RCX;
  scale_factors *in_RDX;
  MACROBLOCKD *unaff_RBX;
  YV12_BUFFER_CONFIG *in_RSI;
  AV1_COMMON *in_RDI;
  long in_R8;
  int *in_R9;
  uint8_t *unaff_retaddr;
  MV_REFERENCE_FRAME in_stack_0000000f;
  MB_MODE_INFO *in_stack_00000010;
  MACROBLOCKD *in_stack_00000018;
  AV1_COMMON *in_stack_00000020;
  scale_factors *sf;
  int num_planes;
  YV12_BUFFER_CONFIG *yv12;
  uint16_t (*in_stack_00000040) [8];
  MV_REFERENCE_FRAME ref_frame_comp;
  MB_MODE_INFO_EXT *mbmi_ext;
  MB_MODE_INFO *mbmi;
  MACROBLOCKD *xd;
  MV_REFERENCE_FRAME *in_stack_ffffffffffffff68;
  AV1_COMMON *in_stack_ffffffffffffff70;
  undefined8 in_stack_ffffffffffffff78;
  AV1_COMMON *in_stack_ffffffffffffff80;
  int num_planes_00;
  YV12_BUFFER_CONFIG *src;
  
  lVar1 = **(long **)&in_RSI[0x27].monochrome;
  if ((&in_RCX->x_scale_fp)[*(char *)(in_R8 + 1)] == 0) {
    src = in_RSI;
    pYVar2 = get_ref_frame_yv12_buf
                       (in_stack_ffffffffffffff80,
                        (MV_REFERENCE_FRAME)((ulong)in_stack_ffffffffffffff78 >> 0x38));
    num_planes_00 = (int)((ulong)in_R8 >> 0x20);
    av1_num_planes(in_RDI);
    if (pYVar2 != (YV12_BUFFER_CONFIG *)0x0) {
      get_ref_scale_factors_const
                (in_stack_ffffffffffffff70,
                 (MV_REFERENCE_FRAME)((ulong)in_stack_ffffffffffffff68 >> 0x38));
      av1_setup_pred_block(unaff_RBX,(buf_2d *)in_RDI,src,in_RDX,in_RCX,num_planes_00);
    }
  }
  ref_frame = av1_ref_frame_type(in_stack_ffffffffffffff68);
  *(undefined2 *)((long)in_RSI[0x50].store_buf_adr + (long)ref_frame * 2 + -0x10) = 0;
  *(undefined1 *)((long)in_RSI[0x4f].store_buf_adr + (long)ref_frame + 0x80) = 0xff;
  av1_find_mv_refs(in_stack_00000020,in_stack_00000018,in_stack_00000010,in_stack_0000000f,
                   unaff_retaddr,(CANDIDATE_MV (*) [8])unaff_RBX,in_stack_00000040,
                   (int_mv (*) [2])mbmi_ext,(int_mv *)mbmi,(int16_t *)xd);
  av1_copy_usable_ref_mv_stack_and_weight
            ((MACROBLOCKD *)(in_RSI + 2),(MB_MODE_INFO_EXT *)(in_RSI[0x4a].store_buf_adr + 1),
             ref_frame);
  *in_R9 = ((byte)(*(ushort *)(lVar1 + 0xa7) >> 4) & 3) + 1;
  return;
}

Assistant:

static void setup_compound_prediction(const AV1_COMMON *cm, MACROBLOCK *x,
                                      struct buf_2d yv12_mb[8][MAX_MB_PLANE],
                                      const int *use_ref_frame_mask,
                                      const MV_REFERENCE_FRAME *rf,
                                      int *ref_mv_idx) {
  MACROBLOCKD *const xd = &x->e_mbd;
  MB_MODE_INFO *const mbmi = xd->mi[0];
  MB_MODE_INFO_EXT *const mbmi_ext = &x->mbmi_ext;
  MV_REFERENCE_FRAME ref_frame_comp;
  if (!use_ref_frame_mask[rf[1]]) {
    // Need to setup pred_block, if it hasn't been done in find_predictors.
    const YV12_BUFFER_CONFIG *yv12 = get_ref_frame_yv12_buf(cm, rf[1]);
    const int num_planes = av1_num_planes(cm);
    if (yv12 != NULL) {
      const struct scale_factors *const sf =
          get_ref_scale_factors_const(cm, rf[1]);
      av1_setup_pred_block(xd, yv12_mb[rf[1]], yv12, sf, sf, num_planes);
    }
  }
  ref_frame_comp = av1_ref_frame_type(rf);
  mbmi_ext->mode_context[ref_frame_comp] = 0;
  mbmi_ext->ref_mv_count[ref_frame_comp] = UINT8_MAX;
  av1_find_mv_refs(cm, xd, mbmi, ref_frame_comp, mbmi_ext->ref_mv_count,
                   xd->ref_mv_stack, xd->weight, NULL, mbmi_ext->global_mvs,
                   mbmi_ext->mode_context);
  av1_copy_usable_ref_mv_stack_and_weight(xd, mbmi_ext, ref_frame_comp);
  *ref_mv_idx = mbmi->ref_mv_idx + 1;
}